

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dePoolHashArray.c
# Opt level: O1

int * deTestHashArrayHash_find(deTestHashArrayHash *hash,deInt16 key)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  int *piVar5;
  deTestHashArrayHashSlot *pdVar6;
  deTestHashArrayHashSlot *pdVar7;
  long lVar8;
  long lVar9;
  
  if (0 < hash->numElements) {
    uVar4 = ((uint)(int)key >> 0x10 ^ (int)key ^ 0x3d) * 9;
    uVar4 = (uVar4 >> 4 ^ uVar4) * 0x27d4eb2d;
    piVar5 = (int *)(long)(int)(hash->slotTableSize - 1U & (uVar4 >> 0xf ^ uVar4));
    pdVar7 = hash->slotTable[(long)piVar5];
    do {
      pdVar6 = pdVar7;
      if (pdVar6 == (deTestHashArrayHashSlot *)0x0) break;
      iVar1 = pdVar6->numUsed;
      bVar2 = 0 < iVar1;
      if (iVar1 < 1) {
LAB_0021a582:
        pdVar7 = pdVar6->nextSlot;
      }
      else {
        if (pdVar6->keys[0] == key) {
          lVar8 = 0;
        }
        else {
          lVar9 = 0;
          do {
            if (iVar1 + -1 == (int)lVar9) {
              bVar2 = false;
              goto LAB_0021a582;
            }
            lVar8 = lVar9 + 1;
            lVar3 = lVar9 + 1;
            lVar9 = lVar8;
          } while (pdVar6->keys[lVar3] != key);
          bVar2 = (int)lVar8 < iVar1;
        }
        piVar5 = pdVar6->values + lVar8;
        pdVar7 = pdVar6;
      }
    } while (!bVar2);
    if (pdVar6 != (deTestHashArrayHashSlot *)0x0) {
      return piVar5;
    }
  }
  return (int *)0x0;
}

Assistant:

void dePoolHashArray_selfTest (void)
{
	deMemPool*			pool		= deMemPool_createRoot(DE_NULL, 0);
	deTestHashArray*	hashArray	= deTestHashArray_create(pool);
	deInt16Array*		keyArray	= deInt16Array_create(pool);
	deIntArray*			valueArray	= deIntArray_create(pool);
	int					iter;

	for (iter = 0; iter < 3; iter++)
	{
		int i;

		/* Insert a bunch of values. */
		DE_TEST_ASSERT(deTestHashArray_getNumElements(hashArray) == 0);
		for (i = 0; i < 20; i++)
		{
			deTestHashArray_insert(hashArray, (deInt16)(-i^0x5), 2*i+5);
		}
		DE_TEST_ASSERT(deTestHashArray_getNumElements(hashArray) == 20);

		deTestHashArray_copyToArray(hashArray, keyArray, DE_NULL);
		deTestHashArray_copyToArray(hashArray, DE_NULL, valueArray);
		DE_TEST_ASSERT(deInt16Array_getNumElements(keyArray) == 20);
		DE_TEST_ASSERT(deIntArray_getNumElements(valueArray) == 20);

		for (i = 0; i < 20; i++)
		{
			DE_TEST_ASSERT(deInt16Array_get(keyArray, i) == (deInt16)(-i^0x5));
			DE_TEST_ASSERT(deIntArray_get(valueArray, i) == 2*i+5);
		}

		deTestHashArray_reset(hashArray);
		DE_TEST_ASSERT(deTestHashArray_getNumElements(hashArray) == 0);

		deTestHashArray_copyToArray(hashArray, keyArray, DE_NULL);
		deTestHashArray_copyToArray(hashArray, DE_NULL, valueArray);

		DE_TEST_ASSERT(deInt16Array_getNumElements(keyArray) == 0);
		DE_TEST_ASSERT(deIntArray_getNumElements(valueArray) == 0);
	}

	deMemPool_destroy(pool);
}